

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::TextureDerivateCase::init(TextureDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  Precision PVar1;
  deUint32 sizedFormat;
  int iVar2;
  int height;
  char *pcVar3;
  mapped_type *pmVar4;
  Texture2D *this_00;
  RenderContext *context;
  Texture2D *pTVar5;
  PixelBufferAccess *pPVar6;
  DataType dataType;
  char *local_4f0;
  char *local_4e8;
  char *local_4c8;
  char *local_4c0;
  char *local_4a0;
  char *local_498;
  Precision local_42c;
  Vector<float,_4> local_408;
  Vector<float,_4> local_3f8;
  Vector<float,_4> local_3e8;
  Vector<float,_4> local_3d8;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  Vector<float,_4> local_398;
  tcu local_388 [16];
  undefined1 local_378 [8];
  Vec4 dy;
  tcu local_358 [16];
  undefined1 local_348 [8];
  Vec4 dx;
  float h;
  float w;
  IVec2 viewportSize_1;
  undefined1 local_320 [16];
  undefined1 local_310 [8];
  Vector<float,_4> local_308;
  Vector<float,_4> local_2f8;
  Vec4 local_2e8;
  undefined1 local_2d8 [8];
  Vec4 s;
  float yf;
  float xf;
  int x;
  int y;
  PixelBufferAccess level0;
  float local_284 [2];
  Vector<float,_4> local_27c;
  undefined1 local_26c [8];
  IVec2 viewportSize;
  undefined1 local_25c [16];
  undefined1 local_24c [16];
  undefined1 local_23c [16];
  undefined1 local_22c [24];
  pointer local_214;
  pointer local_20c;
  allocator<char> local_201;
  string local_200;
  StringTemplate local_1e0;
  string local_1c0;
  allocator<char> local_199;
  key_type local_198;
  allocator<char> local_171;
  key_type local_170;
  allocator<char> local_149;
  key_type local_148;
  allocator<char> local_121;
  key_type local_120;
  allocator<char> local_f9;
  key_type local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  allocator<char> local_81;
  key_type local_80;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  bool packToInt;
  char *fragmentTmpl;
  TextureDerivateCase *this_local;
  
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       (this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_FLOAT_FBO;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  dataType = TYPE_FLOAT_VEC4;
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    dataType = TYPE_UINT_VEC4;
  }
  pcVar3 = glu::getDataTypeName(dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"OUTPUT_TYPE",&local_81);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_80);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    local_42c = (this->super_TriangleDerivateCase).m_precision;
  }
  else {
    local_42c = PRECISION_HIGHP;
  }
  pcVar3 = glu::getPrecisionName(local_42c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"OUTPUT_PREC",&local_a9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_a8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pcVar3 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"PRECISION",&local_d1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_d0);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pcVar3 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"DATATYPE",&local_f9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_f8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pcVar3 = getDerivateFuncName(*(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"FUNC",&local_121);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_120);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC4) {
    local_498 = "";
  }
  else {
    if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC3) {
      local_4a0 = ".xyz";
    }
    else {
      local_4a0 = ".x";
      if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC2) {
        local_4a0 = ".xy";
      }
    }
    local_498 = local_4a0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"SWIZZLE",&local_149);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_50,&local_148);
  std::__cxx11::string::operator=((string *)pmVar4,local_498);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC4) {
      local_4e8 = "res";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC3) {
        local_4f0 = "vec4(res, 1.0)";
      }
      else {
        local_4f0 = "vec4(res, 0.0, 0.0, 1.0)";
        if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC2) {
          local_4f0 = "vec4(res, 0.0, 1.0)";
        }
      }
      local_4e8 = local_4f0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"CAST_TO_OUTPUT",&local_199);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_198);
    std::__cxx11::string::operator=((string *)pmVar4,local_4e8);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
  }
  else {
    if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC4) {
      local_4c0 = "floatBitsToUint(res)";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC3) {
        local_4c8 = "floatBitsToUint(vec4(res, 1.0))";
      }
      else {
        local_4c8 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
        if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC2) {
          local_4c8 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
        }
      }
      local_4c0 = local_4c8;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"CAST_TO_OUTPUT",&local_171);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_50,&local_170);
    std::__cxx11::string::operator=((string *)pmVar4,local_4c0);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,
             "#version 300 es\nin highp vec2 v_coord;\nlayout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\nuniform ${PRECISION} sampler2D u_sampler;\nuniform ${PRECISION} ${DATATYPE} u_scale;\nuniform ${PRECISION} ${DATATYPE} u_bias;\nvoid main (void)\n{\n\t${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n\t${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n\to_color = ${CAST_TO_OUTPUT};\n}\n"
             ,&local_201);
  tcu::StringTemplate::StringTemplate(&local_1e0,&local_200);
  tcu::StringTemplate::specialize
            (&local_1c0,&local_1e0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  tcu::StringTemplate::~StringTemplate(&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  PVar1 = (this->super_TriangleDerivateCase).m_precision;
  if (PVar1 == PRECISION_LOWP) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_25c + 8),0.0,-1.0,0.0,1.0);
    *(undefined8 *)(this->m_texValueMin).m_data = local_25c._8_8_;
    *(undefined8 *)((this->m_texValueMin).m_data + 2) = local_24c._0_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&viewportSize,1.0,1.0,-1.0,-1.0);
    *(int (*) [2])(this->m_texValueMax).m_data = viewportSize.m_data;
    *(undefined8 *)((this->m_texValueMax).m_data + 2) = local_25c._0_8_;
  }
  else if (PVar1 == PRECISION_MEDIUMP) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_23c + 8),-37.0,47.0,-7.0,0.0);
    *(undefined8 *)(this->m_texValueMin).m_data = local_23c._8_8_;
    *(undefined8 *)((this->m_texValueMin).m_data + 2) = local_22c._0_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_24c + 8),-1.0,12.0,7.0,19.0);
    *(undefined8 *)(this->m_texValueMax).m_data = local_24c._8_8_;
    *(undefined8 *)((this->m_texValueMax).m_data + 2) = local_23c._0_8_;
  }
  else if (PVar1 == PRECISION_HIGHP) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_214,-97.0,0.2,71.0,74.0);
    *(pointer *)(this->m_texValueMin).m_data = local_214;
    *(pointer *)((this->m_texValueMin).m_data + 2) = local_20c;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_22c + 8),-13.2,-77.0,44.0,76.0);
    *(undefined8 *)(this->m_texValueMax).m_data = local_22c._8_8_;
    *(undefined8 *)((this->m_texValueMax).m_data + 2) = local_22c._16_8_;
  }
  TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)local_26c);
  this_00 = (Texture2D *)operator_new(0x70);
  context = gles3::Context::getRenderContext
                      ((this->super_TriangleDerivateCase).super_TestCase.m_context);
  sizedFormat = 0x881a;
  if ((this->super_TriangleDerivateCase).m_precision == PRECISION_HIGHP) {
    sizedFormat = 0x8814;
  }
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_26c);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_26c);
  glu::Texture2D::Texture2D(this_00,context,sizedFormat,iVar2,height);
  this->m_texture = this_00;
  pTVar5 = glu::Texture2D::getRefTexture(this->m_texture);
  tcu::Texture2D::allocLevel(pTVar5,0);
  tcu::Vector<float,_4>::Vector(&local_27c,0.0);
  *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMin.m_data = local_27c.m_data._0_8_;
  *(undefined8 *)((this->super_TriangleDerivateCase).m_coordMin.m_data + 2) = local_27c.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)((long)&level0.super_ConstPixelBufferAccess.m_data + 4),1.0);
  *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMax.m_data = stack0xfffffffffffffd74;
  *(float (*) [2])((this->super_TriangleDerivateCase).m_coordMax.m_data + 2) = local_284;
  pTVar5 = glu::Texture2D::getRefTexture(this->m_texture);
  pPVar6 = tcu::TextureLevelPyramid::getLevel(&pTVar5->super_TextureLevelPyramid,0);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&x,pPVar6);
  for (xf = 0.0; iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&x),
      (int)xf < iVar2; xf = (float)((int)xf + 1)) {
    for (yf = 0.0; iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&x),
        (int)yf < iVar2; yf = (float)((int)yf + 1)) {
      iVar2 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&x);
      s.m_data[3] = ((float)(int)yf + 0.5) / (float)iVar2;
      iVar2 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&x);
      s.m_data[2] = ((float)(int)xf + 0.5) / (float)iVar2;
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)local_2d8,s.m_data[3],s.m_data[2],
                 (s.m_data[3] + s.m_data[2]) / 2.0,1.0 - (s.m_data[3] + s.m_data[2]) / 2.0);
      tcu::operator-((tcu *)&local_308,&this->m_texValueMax,&this->m_texValueMin);
      tcu::operator*((tcu *)&local_2f8,&local_308,(Vector<float,_4> *)local_2d8);
      tcu::operator+((tcu *)&local_2e8,&this->m_texValueMin,&local_2f8);
      tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&x,&local_2e8,(int)yf,(int)xf,0);
    }
  }
  (*this->m_texture->_vptr_Texture2D[2])();
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_320 + 8),1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_320._8_8_;
    *(undefined1 (*) [8])((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = local_310;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&viewportSize_1,0.0);
    *(int (*) [2])(this->super_TriangleDerivateCase).m_derivBias.m_data = viewportSize_1.m_data;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_derivBias.m_data + 2) = local_320._0_8_;
  }
  else {
    TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)&h);
    iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&h);
    dx.m_data[3] = (float)iVar2;
    iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&h);
    dx.m_data[2] = (float)iVar2;
    tcu::operator-(local_358,&this->m_texValueMax,&this->m_texValueMin);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(dy.m_data + 2),dx.m_data[3],dx.m_data[3],dx.m_data[3] * 0.5,
               -dx.m_data[3] * 0.5);
    tcu::operator/((tcu *)local_348,(Vector<float,_4> *)local_358,
                   (Vector<float,_4> *)(dy.m_data + 2));
    tcu::operator-(local_388,&this->m_texValueMax,&this->m_texValueMin);
    tcu::Vector<float,_4>::Vector
              (&local_398,dx.m_data[2],dx.m_data[2],dx.m_data[2] * 0.5,-dx.m_data[2] * 0.5);
    tcu::operator/((tcu *)local_378,(Vector<float,_4> *)local_388,&local_398);
    iVar2 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
    if (iVar2 == 0) {
      tcu::operator/((tcu *)&local_3a8,0.5,(Vector<float,_4> *)local_348);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_3a8;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = local_3a0;
    }
    else if (iVar2 == 1) {
      tcu::operator/((tcu *)&local_3b8,0.5,(Vector<float,_4> *)local_378);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_3b8;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = local_3b0;
    }
    else if (iVar2 == 2) {
      tcu::abs<float,4>((tcu *)&local_3e8,(Vector<float,_4> *)local_348);
      tcu::abs<float,4>((tcu *)&local_3f8,(Vector<float,_4> *)local_378);
      tcu::operator+((tcu *)&local_3d8,&local_3e8,&local_3f8);
      tcu::operator/((tcu *)&local_3c8,0.5,&local_3d8);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_3c8;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = local_3c0;
    }
    tcu::Vector<float,_4>::Vector(&local_408,0.0,0.0,0.0,0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_derivBias.m_data = local_408.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_derivBias.m_data + 2) =
         local_408.m_data._8_8_;
  }
  return (int)this;
}

Assistant:

void TextureDerivateCase::init (void)
{
	// Generate shader
	{
		const char* fragmentTmpl =
			"#version 300 es\n"
			"in highp vec2 v_coord;\n"
			"layout(location = 0) out ${OUTPUT_PREC} ${OUTPUT_TYPE} o_color;\n"
			"uniform ${PRECISION} sampler2D u_sampler;\n"
			"uniform ${PRECISION} ${DATATYPE} u_scale;\n"
			"uniform ${PRECISION} ${DATATYPE} u_bias;\n"
			"void main (void)\n"
			"{\n"
			"	${PRECISION} vec4 tex = texture(u_sampler, v_coord);\n"
			"	${PRECISION} ${DATATYPE} res = ${FUNC}(tex${SWIZZLE}) * u_scale + u_bias;\n"
			"	o_color = ${CAST_TO_OUTPUT};\n"
			"}\n";

		const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
		map<string, string> fragmentParams;

		fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
		fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
		fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
		fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
		fragmentParams["FUNC"]				= getDerivateFuncName(m_func);
		fragmentParams["SWIZZLE"]			= m_dataType == glu::TYPE_FLOAT_VEC4 ? "" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? ".xyz" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? ".xy" :
											  /* TYPE_FLOAT */					   ".x";

		if (packToInt)
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
												  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
		}
		else
		{
			fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
												  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
												  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
												  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
		}

		m_fragmentSrc = tcu::StringTemplate(fragmentTmpl).specialize(fragmentParams);
	}

	// Texture size matches viewport and nearest sampling is used. Thus texture sampling
	// is equal to just interpolating the texture value range.

	// Determine value range for texture.

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_texValueMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_texValueMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_texValueMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_texValueMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_texValueMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_texValueMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	// Lowp and mediump cases use RGBA16F format, while highp uses RGBA32F.
	{
		const tcu::IVec2 viewportSize = getViewportSize();
		DE_ASSERT(!m_texture);
		m_texture = new glu::Texture2D(m_context.getRenderContext(), m_precision == glu::PRECISION_HIGHP ? GL_RGBA32F : GL_RGBA16F, viewportSize.x(), viewportSize.y());
		m_texture->getRefTexture().allocLevel(0);
	}

	// Texture coordinates
	m_coordMin = tcu::Vec4(0.0f);
	m_coordMax = tcu::Vec4(1.0f);

	// Fill with gradients.
	{
		const tcu::PixelBufferAccess level0 = m_texture->getRefTexture().getLevel(0);
		for (int y = 0; y < level0.getHeight(); y++)
		{
			for (int x = 0; x < level0.getWidth(); x++)
			{
				const float		xf		= (float(x)+0.5f) / float(level0.getWidth());
				const float		yf		= (float(y)+0.5f) / float(level0.getHeight());
				const tcu::Vec4	s		= tcu::Vec4(xf, yf, (xf+yf)/2.0f, 1.0f - (xf+yf)/2.0f);

				level0.setPixel(m_texValueMin + (m_texValueMax - m_texValueMin)*s, x, y);
			}
		}
	}

	m_texture->upload();

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::IVec2	viewportSize	= getViewportSize();
		const float			w				= float(viewportSize.x());
		const float			h				= float(viewportSize.y());
		const tcu::Vec4		dx				= (m_texValueMax - m_texValueMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4		dy				= (m_texValueMax - m_texValueMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}